

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O1

void __thiscall Json::OurReader::OurReader(OurReader *this,OurFeatures *features)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  undefined6 uVar10;
  
  (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
  super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
  super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
  super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
  super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
  super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
  super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
  super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
  super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
  super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
  super__Deque_impl_data._M_map_size = 0;
  std::_Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>::_M_initialize_map
            ((_Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_> *)this,0);
  (this->errors_).
  super__Deque_base<Json::OurReader::ErrorInfo,_std::allocator<Json::OurReader::ErrorInfo>_>._M_impl
  .super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  (this->errors_).
  super__Deque_base<Json::OurReader::ErrorInfo,_std::allocator<Json::OurReader::ErrorInfo>_>._M_impl
  .super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  (this->errors_).
  super__Deque_base<Json::OurReader::ErrorInfo,_std::allocator<Json::OurReader::ErrorInfo>_>._M_impl
  .super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  (this->errors_).
  super__Deque_base<Json::OurReader::ErrorInfo,_std::allocator<Json::OurReader::ErrorInfo>_>._M_impl
  .super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  (this->errors_).
  super__Deque_base<Json::OurReader::ErrorInfo,_std::allocator<Json::OurReader::ErrorInfo>_>._M_impl
  .super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  (this->errors_).
  super__Deque_base<Json::OurReader::ErrorInfo,_std::allocator<Json::OurReader::ErrorInfo>_>._M_impl
  .super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  (this->errors_).
  super__Deque_base<Json::OurReader::ErrorInfo,_std::allocator<Json::OurReader::ErrorInfo>_>._M_impl
  .super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  (this->errors_).
  super__Deque_base<Json::OurReader::ErrorInfo,_std::allocator<Json::OurReader::ErrorInfo>_>._M_impl
  .super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  (this->errors_).
  super__Deque_base<Json::OurReader::ErrorInfo,_std::allocator<Json::OurReader::ErrorInfo>_>._M_impl
  .super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  (this->errors_).
  super__Deque_base<Json::OurReader::ErrorInfo,_std::allocator<Json::OurReader::ErrorInfo>_>._M_impl
  .super__Deque_impl_data._M_map_size = 0;
  std::_Deque_base<Json::OurReader::ErrorInfo,_std::allocator<Json::OurReader::ErrorInfo>_>::
  _M_initialize_map(&(this->errors_).
                     super__Deque_base<Json::OurReader::ErrorInfo,_std::allocator<Json::OurReader::ErrorInfo>_>
                    ,0);
  (this->document_)._M_dataplus._M_p = (pointer)&(this->document_).field_2;
  (this->document_)._M_string_length = 0;
  (this->document_).field_2._M_local_buf[0] = '\0';
  this->begin_ = (Location)0x0;
  this->end_ = (Location)0x0;
  this->current_ = (Location)0x0;
  this->lastValueEnd_ = (Location)0x0;
  *(undefined8 *)((long)&this->lastValueEnd_ + 1) = 0;
  *(undefined8 *)((long)&this->lastValue_ + 1) = 0;
  (this->commentsBefore_)._M_dataplus._M_p = (pointer)&(this->commentsBefore_).field_2;
  (this->commentsBefore_)._M_string_length = 0;
  (this->commentsBefore_).field_2._M_local_buf[0] = '\0';
  bVar1 = features->allowTrailingCommas_;
  bVar2 = features->strictRoot_;
  bVar3 = features->allowDroppedNullPlaceholders_;
  bVar4 = features->allowNumericKeys_;
  bVar5 = features->allowSingleQuotes_;
  bVar6 = features->failIfExtra_;
  bVar7 = features->rejectDupKeys_;
  bVar8 = features->allowSpecialFloats_;
  bVar9 = features->skipBom_;
  uVar10 = *(undefined6 *)&features->field_0xa;
  (this->features_).allowComments_ = features->allowComments_;
  (this->features_).allowTrailingCommas_ = bVar1;
  (this->features_).strictRoot_ = bVar2;
  (this->features_).allowDroppedNullPlaceholders_ = bVar3;
  (this->features_).allowNumericKeys_ = bVar4;
  (this->features_).allowSingleQuotes_ = bVar5;
  (this->features_).failIfExtra_ = bVar6;
  (this->features_).rejectDupKeys_ = bVar7;
  (this->features_).allowSpecialFloats_ = bVar8;
  (this->features_).skipBom_ = bVar9;
  *(undefined6 *)&(this->features_).field_0xa = uVar10;
  (this->features_).stackLimit_ = features->stackLimit_;
  this->collectComments_ = false;
  return;
}

Assistant:

OurReader::OurReader(OurFeatures const& features) : features_(features) {}